

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpt.cpp
# Opt level: O0

void __thiscall
pg::QPTSolver::updateState
          (QPTSolver *this,unsigned_long *_n0,unsigned_long *_n1,int *_max0,int *_max1,int *_k0,
          int *_k1)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  int local_54;
  int pr;
  int i;
  int max1;
  int max0;
  unsigned_long n1;
  unsigned_long n0;
  int *_k0_local;
  int *_max1_local;
  int *_max0_local;
  unsigned_long *_n1_local;
  unsigned_long *_n0_local;
  QPTSolver *this_local;
  
  n1 = 0;
  _max1 = 0;
  i = -1;
  pr = -1;
  for (local_54 = 0; lVar4 = Solver::nodecount(&this->super_Solver), local_54 < lVar4;
      local_54 = local_54 + 1) {
    bVar1 = bitset::operator[]((this->super_Solver).disabled,(long)local_54);
    if (!bVar1) {
      uVar2 = Solver::priority(&this->super_Solver,local_54);
      if ((uVar2 & 1) == 0) {
        if (i < (int)uVar2) {
          i = uVar2;
        }
        n1 = n1 + 1;
      }
      else {
        if (pr < (int)uVar2) {
          pr = uVar2;
        }
        _max1 = _max1 + 1;
      }
    }
  }
  *_n0 = n1;
  *_n1 = _max1;
  *_max0 = i;
  *_max1 = pr;
  iVar3 = ceil_log2(n1 + 1);
  *_k0 = iVar3 + 1;
  iVar3 = ceil_log2(_max1 + 1);
  *_k1 = iVar3 + 1;
  return;
}

Assistant:

void
QPTSolver::updateState(unsigned long &_n0, unsigned long &_n1, int &_max0, int &_max1, int &_k0, int &_k1)
{
    // determine number of even/odd vertices and highest even/odd priority
    unsigned long n0 = 0;
    unsigned long n1 = 0;
    int max0 = -1;
    int max1 = -1;

    for (int i=0; i<nodecount(); i++) {
        if (disabled[i]) continue;
        const int pr = priority(i);
        if ((pr&1) == 0) {
            if (pr > max0) max0 = pr;
            n0++;
        } else {
            if (pr > max1) max1 = pr;
            n1++;
        }
    }

    _n0 = n0;
    _n1 = n1;
    _max0 = max0;
    _max1 = max1;

    _k0 = 1+ceil_log2(n0+1);
    _k1 = 1+ceil_log2(n1+1);
}